

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O2

void __thiscall ClipperLib::Clipper::DoMaxima(Clipper *this,TEdge *e,long64 topY)

{
  long64 lVar1;
  TEdge *e_00;
  clipperException *this_00;
  TEdge *e2;
  IntPoint local_40;
  
  e_00 = GetMaximaPair(e);
  lVar1 = e->xtop;
  e2 = e;
  do {
    e2 = e2->nextInAEL;
    if (e2 == e_00) {
      if (e->outIdx < 0) {
        if (e_00->outIdx < 0) {
          DeleteFromAEL(this,e);
          DeleteFromAEL(this,e_00);
          return;
        }
      }
      else if (-1 < e_00->outIdx) {
        local_40.X = lVar1;
        local_40.Y = topY;
        IntersectEdges(this,e,e_00,&local_40,ipNone);
        return;
      }
      this_00 = (clipperException *)__cxa_allocate_exception(0x28);
      clipperException::clipperException(this_00,"DoMaxima error");
LAB_005881b9:
      __cxa_throw(this_00,&clipperException::typeinfo,clipperException::~clipperException);
    }
    if (e2 == (TEdge *)0x0) {
      this_00 = (clipperException *)__cxa_allocate_exception(0x28);
      clipperException::clipperException(this_00,"DoMaxima error");
      goto LAB_005881b9;
    }
    local_40.X = lVar1;
    local_40.Y = topY;
    IntersectEdges(this,e,e2,&local_40,ipBoth);
  } while( true );
}

Assistant:

void Clipper::DoMaxima(TEdge *e, long64 topY)
{
  TEdge* eMaxPair = GetMaximaPair(e);
  long64 X = e->xtop;
  TEdge* eNext = e->nextInAEL;
  while( eNext != eMaxPair )
  {
    if (!eNext) throw clipperException("DoMaxima error");
    IntersectEdges( e, eNext, IntPoint(X, topY), ipBoth );
    eNext = eNext->nextInAEL;
  }
  if( e->outIdx < 0 && eMaxPair->outIdx < 0 )
  {
    DeleteFromAEL( e );
    DeleteFromAEL( eMaxPair );
  }
  else if( e->outIdx >= 0 && eMaxPair->outIdx >= 0 )
  {
    IntersectEdges( e, eMaxPair, IntPoint(X, topY), ipNone );
  }
  else throw clipperException("DoMaxima error");
}